

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ExtensionSet::SwapElements
          (ExtensionSet *this,int number,int index1,int index2)

{
  byte bVar1;
  undefined1 uVar2;
  undefined4 uVar3;
  LogMessage *pLVar4;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  _Base_ptr p_Var7;
  LogFinisher local_61;
  LogMessage local_60;
  
  p_Var5 = (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &(this->extensions_)._M_t._M_impl.super__Rb_tree_header;
  p_Var7 = &p_Var6->_M_header;
  if (p_Var5 == (_Base_ptr)0x0) {
LAB_00347140:
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x336);
    pLVar4 = LogMessage::operator<<(&local_60,"CHECK failed: iter != extensions_.end(): ");
    pLVar4 = LogMessage::operator<<(pLVar4,"Index out-of-bounds (field is empty).");
    LogFinisher::operator=(&local_61,pLVar4);
    LogMessage::~LogMessage(&local_60);
    p_Var7 = &p_Var6->_M_header;
  }
  else {
    do {
      if (number <= (int)p_Var5[1]._M_color) {
        p_Var7 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < number];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var7 == p_Var6) || (number < (int)p_Var7[1]._M_color))
    goto LAB_00347140;
  }
  if (*(char *)((long)&p_Var7[1]._M_left + 1) == '\0') {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x339);
    pLVar4 = LogMessage::operator<<(&local_60,"CHECK failed: extension->is_repeated: ");
    LogFinisher::operator=(&local_61,pLVar4);
    LogMessage::~LogMessage(&local_60);
  }
  bVar1 = *(byte *)&p_Var7[1]._M_left;
  if ((byte)(bVar1 - 0x13) < 0xee) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x34);
    pLVar4 = LogMessage::operator<<
                       (&local_60,
                        "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
    LogFinisher::operator=(&local_61,pLVar4);
    LogMessage::~LogMessage(&local_60);
  }
  switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4)) {
  case 1:
  case 3:
  case 8:
    p_Var5 = (p_Var7[1]._M_parent)->_M_parent;
    uVar3 = *(undefined4 *)((long)&p_Var5->_M_parent + (long)index1 * 4);
    *(undefined4 *)((long)&p_Var5->_M_parent + (long)index1 * 4) =
         *(undefined4 *)((long)&p_Var5->_M_parent + (long)index2 * 4);
    *(undefined4 *)((long)&p_Var5->_M_parent + (long)index2 * 4) = uVar3;
    break;
  case 2:
  case 4:
    p_Var5 = (p_Var7[1]._M_parent)->_M_parent;
    goto LAB_00347287;
  case 5:
    p_Var7 = (p_Var7[1]._M_parent)->_M_parent;
    p_Var5 = (&p_Var7->_M_parent)[index1];
    (&p_Var7->_M_parent)[index1] = (&p_Var7->_M_parent)[index2];
    (&p_Var7->_M_parent)[index2] = p_Var5;
    break;
  case 6:
    p_Var5 = (p_Var7[1]._M_parent)->_M_parent;
    uVar3 = *(undefined4 *)((long)&p_Var5->_M_parent + (long)index1 * 4);
    *(undefined4 *)((long)&p_Var5->_M_parent + (long)index1 * 4) =
         *(undefined4 *)((long)&p_Var5->_M_parent + (long)index2 * 4);
    *(undefined4 *)((long)&p_Var5->_M_parent + (long)index2 * 4) = uVar3;
    break;
  case 7:
    p_Var5 = (p_Var7[1]._M_parent)->_M_parent;
    uVar2 = *(undefined1 *)((long)&p_Var5->_M_parent + (long)index1);
    *(undefined1 *)((long)&p_Var5->_M_parent + (long)index1) =
         *(undefined1 *)((long)&p_Var5->_M_parent + (long)index2);
    *(undefined1 *)((long)&p_Var5->_M_parent + (long)index2) = uVar2;
    break;
  case 9:
  case 10:
    p_Var5 = (p_Var7[1]._M_parent)->_M_left;
LAB_00347287:
    p_Var7 = (&p_Var5->_M_parent)[index1];
    (&p_Var5->_M_parent)[index1] = (&p_Var5->_M_parent)[index2];
    (&p_Var5->_M_parent)[index2] = p_Var7;
  }
  return;
}

Assistant:

void ExtensionSet::SwapElements(int number, int index1, int index2) {
  ExtensionMap::iterator iter = extensions_.find(number);
  GOOGLE_CHECK(iter != extensions_.end()) << "Index out-of-bounds (field is empty).";

  Extension* extension = &iter->second;
  GOOGLE_DCHECK(extension->is_repeated);

  switch(cpp_type(extension->type)) {
    case WireFormatLite::CPPTYPE_INT32:
      extension->repeated_int32_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_INT64:
      extension->repeated_int64_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_UINT32:
      extension->repeated_uint32_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_UINT64:
      extension->repeated_uint64_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_FLOAT:
      extension->repeated_float_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_DOUBLE:
      extension->repeated_double_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_BOOL:
      extension->repeated_bool_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_ENUM:
      extension->repeated_enum_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_STRING:
      extension->repeated_string_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_MESSAGE:
      extension->repeated_message_value->SwapElements(index1, index2);
      break;
  }
}